

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  uint in_EDX;
  float *in_RSI;
  char *in_RDI;
  float fVar1;
  ImVec2 sz;
  char *text_end;
  int ca;
  int cb;
  int cg;
  int cr;
  ImGuiContext *g;
  char *in_stack_00000098;
  char *in_stack_000000a0;
  ImGuiColorEditFlags in_stack_000000c4;
  ImVec4 *in_stack_000000c8;
  char *in_stack_000000d0;
  ImVec2 in_stack_000000dc;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  char *local_68;
  undefined1 in_stack_ffffffffffffffa3;
  ImVec4 local_50;
  ImVec2 local_40;
  char *local_38;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  ImGuiContext *local_20;
  uint local_14;
  float *local_10;
  char *local_8;
  
  local_20 = GImGui;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fVar1 = ImSaturate(*in_RSI);
  local_24 = (uint)(fVar1 * 255.0 + 0.5);
  fVar1 = ImSaturate(local_10[1]);
  local_28 = (uint)(fVar1 * 255.0 + 0.5);
  fVar1 = ImSaturate(local_10[2]);
  local_2c = (uint)(fVar1 * 255.0 + 0.5);
  if ((local_14 & 2) == 0) {
    fVar1 = ImSaturate(local_10[3]);
    local_30 = (uint)(fVar1 * 255.0 + 0.5);
  }
  else {
    local_30 = 0xff;
  }
  BeginTooltipEx(local_30,(bool)in_stack_ffffffffffffffa3);
  if (local_8 == (char *)0x0) {
    local_68 = local_8;
  }
  else {
    local_68 = FindRenderedTextEnd(local_8,(char *)0x0);
  }
  local_38 = local_68;
  if (local_8 < local_68) {
    TextUnformatted(in_stack_000000a0,in_stack_00000098);
    Separator();
  }
  fVar1 = (local_20->Style).FramePadding.y;
  fVar1 = local_20->FontSize * 3.0 + fVar1 + fVar1;
  ImVec2::ImVec2(&local_40,fVar1,fVar1);
  ImVec4::ImVec4(&local_50,*local_10,local_10[1],local_10[2],local_10[3]);
  ColorButton(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000dc);
  SameLine(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
  if ((local_14 & 2) == 0) {
    Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],(double)local_10[3],
         "#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",(ulong)local_24,
         (ulong)local_28,(ulong)local_2c,(ulong)local_30,(ulong)local_24,local_28,local_2c,local_30)
    ;
  }
  else {
    Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],
         "#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",(ulong)local_24,(ulong)local_28,
         (ulong)local_2c,(ulong)local_24,(ulong)local_28,local_2c);
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    BeginTooltipEx(0, true);

    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextUnformatted(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ColorButton("##preview", ImVec4(col[0], col[1], col[2], col[3]), (flags & (ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if (flags & ImGuiColorEditFlags_NoAlpha)
        Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
    else
        Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    EndTooltip();
}